

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O0

void __thiscall
DyndepParserTestOutDuplicate::DyndepParserTestOutDuplicate(DyndepParserTestOutDuplicate *this)

{
  DyndepParserTestOutDuplicate *this_local;
  
  DyndepParserTest::DyndepParserTest(&this->super_DyndepParserTest);
  (this->super_DyndepParserTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DyndepParserTestOutDuplicate_002627f8;
  return;
}

Assistant:

TEST_F(DyndepParserTest, OutDuplicate) {
  const char kInput[] =
"ninja_dyndep_version = 1\n"
"build out: dyndep\n"
"build out: dyndep\n";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:3: multiple statements for 'out'\n"
            "build out: dyndep\n"
            "         ^ near here", err);
}